

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

void __thiscall
Pl_Base64::Pl_Base64(Pl_Base64 *this,char *identifier,Pipeline *next,action_e action)

{
  logic_error *this_00;
  action_e action_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_Base64 *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Base64_006f0ae8;
  this->action = action;
  this->buf[0] = '\0';
  this->buf[1] = '\0';
  this->buf[2] = '\0';
  this->buf[3] = '\0';
  this->pos = 0;
  this->end_of_data = false;
  this->finished = false;
  if (next == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_Base64 with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

Pl_Base64::Pl_Base64(char const* identifier, Pipeline* next, action_e action) :
    Pipeline(identifier, next),
    action(action)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Base64 with nullptr as next");
    }
}